

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall presolve::HPresolve::reinsertEquation(HPresolve *this,HighsInt row)

{
  double *pdVar1;
  double dVar2;
  const_iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_bool> pVar3;
  int local_1c;
  
  dVar2 = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  pdVar1 = (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + row;
  if ((((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) &&
      (__position._M_node =
            (this->eqiters).
            super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[row]._M_node,
      (_Rb_tree_header *)__position._M_node != &(this->equations)._M_t._M_impl.super__Rb_tree_header
      )) && (__position._M_node[1]._M_color !=
             (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[row])) {
    local_1c = row;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::erase_abi_cxx11_((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                        *)&this->equations,__position);
    pVar3 = std::
            _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
            ::_M_emplace_unique<int&,int&>
                      ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                        *)&this->equations,
                       (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + local_1c,&local_1c);
    (this->eqiters).
    super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[local_1c]._M_node = pVar3.first._M_node._M_node;
  }
  return;
}

Assistant:

void HPresolve::reinsertEquation(HighsInt row) {
  // check if this is an equation row and it now has a different size
  if (model->row_lower_[row] == model->row_upper_[row] &&
      eqiters[row] != equations.end() && eqiters[row]->first != rowsize[row]) {
    // if that is the case reinsert it into the equation set that is ordered
    // by sparsity
    equations.erase(eqiters[row]);
    eqiters[row] = equations.emplace(rowsize[row], row).first;
  }
}